

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateStackScriptFunctionInit
          (Lowerer *this,RegOpnd *regOpnd,FunctionInfoPtrPtr nestedInfo,Opnd *envOpnd,
          Instr *insertBeforeInstr)

{
  Func *func;
  ScriptContextInfo *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  AddrOpnd *pAVar3;
  IndirOpnd *dst;
  
  func = this->m_func;
  pSVar1 = insertBeforeInstr->m_func->m_scriptContextInfo;
  iVar2 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,0x2e);
  pAVar3 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar2),AddrOpndKindDynamicVtable,
                             this->m_func,false,(Var)0x0);
  GenerateScriptFunctionInit
            (this,regOpnd,&pAVar3->super_Opnd,nestedInfo,envOpnd,insertBeforeInstr,false);
  dst = IR::IndirOpnd::New(regOpnd,0x48,TyUint64,func,false);
  pAVar3 = IR::AddrOpnd::NewNull(func);
  InsertMove(&dst->super_Opnd,&pAVar3->super_Opnd,insertBeforeInstr,true);
  return;
}

Assistant:

void
Lowerer::GenerateStackScriptFunctionInit(IR::RegOpnd * regOpnd, Js::FunctionInfoPtrPtr nestedInfo, IR::Opnd * envOpnd, IR::Instr * insertBeforeInstr)
{
    Func * func = this->m_func;
    GenerateScriptFunctionInit(regOpnd,
        LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableStackScriptFunction),
        nestedInfo, envOpnd, insertBeforeInstr);
    InsertMove(IR::IndirOpnd::New(regOpnd, Js::StackScriptFunction::GetOffsetOfBoxedScriptFunction(), TyMachPtr, func),
        IR::AddrOpnd::NewNull(func), insertBeforeInstr);
}